

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeInternalForces
          (ChElementBeamEuler *this,ChVectorDynamic<> *Fi)

{
  ChQuaternion<double> *q;
  element_type *peVar1;
  pointer psVar2;
  double dVar3;
  int i;
  ulong uVar4;
  long startRow;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVectorDynamic<> Fi_local;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  double node_multiplier;
  ChVectorDynamic<> displ_dt;
  ChMatrixDynamic<> Mloc;
  ChMatrixDynamic<> FiR_local;
  ChVectorDynamic<> displ;
  double node_multiplier_fact;
  ChVector<double> mTgyro_i;
  ChVector<double> mFcent_i;
  ChMatrix33<double> AtolocwelA;
  ChMatrix33<double> AtolocwelB;
  ChMatrix33<double> Atoabs;
  long local_388;
  void *local_380 [2];
  undefined1 local_370 [40];
  Matrix<double,__1,_1,_0,__1,_1> local_348;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_338;
  double local_2f8;
  double local_2f0;
  Matrix<double,__1,__1,_1,__1,__1> local_2e8;
  Matrix<double,__1,_1,_0,__1,_1> local_2d0;
  undefined1 local_2c0 [72];
  double *local_278 [3];
  double **local_260 [2];
  ChVector<double> local_250;
  ChMatrix33<double> local_238;
  ChMatrix33<double> local_1f0;
  ChMatrixRef local_1a8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_180 [6];
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x2cb,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_180[0].m_lhs._0_4_ = 0xc;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_2d0,(int *)local_180);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
              (this,&local_2d0);
    local_180[0].m_lhs._0_16_ =
         (undefined1  [16])
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Km,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_2d0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_380,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_180);
    local_180[0].m_lhs._0_4_ = 0xc;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_348,(int *)local_180);
    GetField_dt(this,&local_348);
    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         ((this->section).
          super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         rdamping_beta;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                      *)&local_238,(double *)&local_1f0,(StorageBaseType *)&this->Km);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
    ::Product(local_180,(Lhs *)&local_238,&local_348);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_2e8,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_180);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_380,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_2e8);
    dVar3 = ((this->section).
             super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->rdamping_alpha;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      local_180[0].m_lhs._0_4_ = 0xc;
      local_238.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
           0xc;
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&local_338,(int *)local_180,(int *)&local_238);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_338);
      peVar1 = (this->section).
               super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar1->super_ChBeamSection)._vptr_ChBeamSection[0xd])(peVar1,local_180);
      startRow = 0;
      local_2c0._0_8_ =
           (this->super_ChElementBeam).length * 0.5 *
           ((this->section).
            super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->rdamping_alpha;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)(this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1)
      {
        Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                    *)&local_1f0,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_180,
                   (double *)local_2c0);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_6,_6,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_6,_6,_false> *)&local_238,
                   (Matrix<double,__1,__1,_1,__1,__1> *)&local_338,startRow,startRow);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,6,6,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,6,6,false>> *)
                   &local_238,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>_>
                    *)&local_1f0);
        startRow = startRow + 6;
      }
      local_238.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
           Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_338,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_348);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                (&local_2e8,
                 (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)&local_238);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_380,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_2e8);
      Eigen::internal::handmade_aligned_free
                (local_338.
                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 .
                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data);
    }
    local_180[0].m_lhs._0_8_ = &DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_380,(Scalar *)local_180);
    q = &this->q_element_abs_rot;
    ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)local_180,q);
    GetNodeA((ChElementBeamEuler *)local_2c0);
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = *(PointerType *)(local_2c0._0_8_ + 0x38);
    auVar5._0_8_ = (ulong)*(_func_int **)(local_2c0._0_8_ + 0x50) ^ 0x8000000000000000;
    auVar5._8_8_ = 0x8000000000000000;
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = (ulong)*(_func_int **)(local_2c0._0_8_ + 0x40) ^ 0x8000000000000000;
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = (ulong)*(_func_int **)(local_2c0._0_8_ + 0x48) ^ 0x8000000000000000;
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = vmovlpd_avx(auVar5);
    ChQuaternion<double>::operator%
              ((ChQuaternion<double> *)&local_1f0,(ChQuaternion<double> *)&local_338,q);
    ChMatrix33<double>::Set_A_quaternion(&local_238,(ChQuaternion<double> *)&local_1f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2c0 + 8));
    GetNodeB((ChElementBeamEuler *)local_370);
    local_2c0._0_8_ = *(_func_int **)(local_370._0_8_ + 0x38);
    auVar6._0_8_ = (ulong)*(_func_int **)(local_370._0_8_ + 0x50) ^ 0x8000000000000000;
    auVar6._8_8_ = 0x8000000000000000;
    local_2c0._8_8_ = (ulong)*(_func_int **)(local_370._0_8_ + 0x40) ^ 0x8000000000000000;
    local_2c0._16_8_ = (ulong)*(_func_int **)(local_370._0_8_ + 0x48) ^ 0x8000000000000000;
    local_2c0._24_8_ = vmovlpd_avx(auVar6);
    ChQuaternion<double>::operator%
              ((ChQuaternion<double> *)&local_338,(ChQuaternion<double> *)local_2c0,q);
    ChMatrix33<double>::Set_A_quaternion(&local_1f0,(ChQuaternion<double> *)&local_338);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_370 + 8));
    local_370._16_8_ = (pointer)0x0;
    local_370._0_8_ = (_func_int **)0x0;
    local_370._8_8_ = (_func_int **)0x0;
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)local_180;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               local_370,(ChMatrix33<double> **)&local_338);
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&local_238;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               local_370,(ChMatrix33<double> **)&local_338);
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)local_180;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               local_370,(ChMatrix33<double> **)&local_338);
    local_338.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&local_1f0;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    emplace_back<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               local_370,(ChMatrix33<double> **)&local_338);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_338,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_380,(type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_1a8,
               &Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0);
    ChMatrixCorotation::ComputeCK
              (&local_338,
               (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                *)local_370,4,&local_1a8);
    Eigen::internal::handmade_aligned_free
              (local_338.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
    dVar3 = 0.0;
    local_388 = 0;
    local_2f0 = 0.0;
    local_370._32_8_ = (this->super_ChElementBeam).length * 0.5;
    local_250.m_data[2] = 0.0;
    local_2c0._64_8_ = 0.0;
    local_250.m_data[0] = 0.0;
    local_250.m_data[1] = 0.0;
    local_2c0._48_8_ = (pointer)0x0;
    local_2c0._56_8_ = (pointer)0x0;
    while( true ) {
      psVar2 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <=
          (ulong)local_2f0) break;
      peVar1 = (this->section).
               super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_2f8 = dVar3;
      ChFrameMoving<double>::GetWvel_loc
                ((ChVector<double> *)&local_338,
                 (ChFrameMoving<double> *)
                 (*(long *)((long)&(psVar2->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + local_388) + 0x18));
      (*(peVar1->super_ChBeamSection)._vptr_ChBeamSection[0x10])
                (peVar1,&local_250,local_2c0 + 0x30,&local_338);
      ChMatrix33<double>::operator*
                ((ChMatrix33<double> *)
                 (*(long *)((long)&(((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + local_388) + 0x58),&local_250);
      local_260[0] = local_278;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_2c0,(double *)(local_370 + 0x20),(StorageBaseType *)local_260);
      dVar3 = local_2f8;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_338,Fi,
                 (Index)local_2f8,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                 &local_338,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)local_2c0);
      local_278[0] = (double *)(local_2c0 + 0x30);
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_2c0,(double *)(local_370 + 0x20),(StorageBaseType *)local_278);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_338,Fi,
                 (long)dVar3 + 3,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                 &local_338,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)local_2c0);
      local_388 = local_388 + 0x10;
      dVar3 = (double)((long)dVar3 + 6);
      local_2f0 = (double)((long)local_2f0 + 1);
    }
    std::_Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>::
    ~_Vector_base((_Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   *)local_370);
    Eigen::internal::handmade_aligned_free
              (local_2e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free(local_380[0]);
    Eigen::internal::handmade_aligned_free
              (local_2d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    return;
  }
  __assert_fail("section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                ,0x2cc,
                "virtual void chrono::fea::ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<> &)"
               );
}

Assistant:

void ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(section);

    // set up vector of nodal displacements and small rotations (in local element system)
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> Fi_local = Km * displ;

    // set up vector of nodal velocities (in local element system)
    ChVectorDynamic<> displ_dt(12);
    this->GetField_dt(displ_dt);

    // Rayleigh damping - stiffness proportional
    ChMatrixDynamic<> FiR_local = section->GetBeamRaleyghDampingBeta() * Km * displ_dt;

    Fi_local += FiR_local;

    // Rayleigh damping - mass proportional
    if (this->section->GetBeamRaleyghDampingAlpha()) {
        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        // the "lumped" M mass matrix must be computed
        ChMatrixNM<double, 6, 6> sectional_mass;
        this->section->ComputeInertiaMatrix(sectional_mass);

        // Rayleigh damping (stiffness proportional part)  [Rm] = alpha*[M] 
        double node_multiplier_fact = 0.5 * length * (this->section->GetBeamRaleyghDampingAlpha());
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6; 
            Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
        }
        FiR_local = Mloc * displ_dt;
        Fi_local += FiR_local;
    }

    Fi_local *= -1.0;

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(Fi_local, R, 4, Fi);


    // Add also inertial quadratic terms: gyroscopic and centrifugal
    
    // CASE OF LUMPED MASS - fast
    double node_multiplier = 0.5 * length;
    ChVector<> mFcent_i;
    ChVector<> mTgyro_i;
    for (int i = 0; i < nodes.size(); ++i) {
        this->section->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        Fi.segment(i * 6, 3)     -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
        Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}